

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_sample.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalStreamingSample::BernoulliSample
          (PhysicalStreamingSample *this,DataChunk *input,DataChunk *result,OperatorState *state_p)

{
  idx_t i;
  ulong uVar1;
  idx_t count_p;
  double dVar2;
  SelectionVector sel;
  SelectionVector local_48;
  
  SelectionVector::SelectionVector(&local_48,0x800);
  count_p = 0;
  for (uVar1 = 0; uVar1 < input->count; uVar1 = uVar1 + 1) {
    dVar2 = RandomEngine::NextRandom((RandomEngine *)(state_p + 1));
    if (dVar2 <= this->percentage) {
      local_48.sel_vector[count_p] = (sel_t)uVar1;
      count_p = count_p + 1;
    }
  }
  if (count_p != 0) {
    DataChunk::Slice(result,input,&local_48,count_p,0);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void PhysicalStreamingSample::BernoulliSample(DataChunk &input, DataChunk &result, OperatorState &state_p) const {
	// bernoulli sampling: we throw one dice per tuple
	// then slice the result chunk
	auto &state = state_p.Cast<StreamingSampleOperatorState>();
	idx_t result_count = 0;
	SelectionVector sel(STANDARD_VECTOR_SIZE);
	for (idx_t i = 0; i < input.size(); i++) {
		double rand = state.random.NextRandom();
		if (rand <= percentage) {
			sel.set_index(result_count++, i);
		}
	}
	if (result_count > 0) {
		result.Slice(input, sel, result_count);
	}
}